

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

GeneralMedium<pbrt::NanoVDBMediumProvider> *
pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>::Create
          (NanoVDBMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  TVar1;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  TVar2;
  bool bVar3;
  uintptr_t iptr;
  RGBSpectrum *pRVar4;
  GeneralMedium<pbrt::NanoVDBMediumProvider> *pGVar5;
  allocator<char> local_b1;
  Float g;
  Float local_ac;
  Allocator alloc_local;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  undefined1 local_90 [32];
  Float sigScale;
  undefined4 uStack_6c;
  NanoVDBMediumProvider *provider_local;
  string preset;
  undefined8 local_28;
  size_t local_20;
  
  sig_a.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  sig_s.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  alloc_local = alloc;
  provider_local = provider;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"preset",(allocator<char> *)&g);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sigScale,"",&local_b1);
  ParameterDictionary::GetOneString(&preset,parameters,(string *)local_90,(string *)&sigScale);
  std::__cxx11::string::~string((string *)&sigScale);
  std::__cxx11::string::~string((string *)local_90);
  if (preset._M_string_length != 0) {
    bVar3 = GetMediumScatteringProperties(&preset,&sig_a,&sig_s,alloc_local);
    if (!bVar3) {
      Warning<std::__cxx11::string&>(loc,"Material preset \"%s\" not found.",&preset);
    }
  }
  if (sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"sigma_a",(allocator<char> *)&g);
    local_20 = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&sigScale,(string *)parameters,(SpectrumHandle *)local_90,
               (SpectrumType)&local_20,(Allocator)0x1);
    TVar1.bits._4_4_ = uStack_6c;
    TVar1.bits._0_4_ = sigScale;
    sig_a.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )TVar1.bits;
    std::__cxx11::string::~string((string *)local_90);
    if (TVar1.bits == 0) {
      local_90._0_8_ = (pointer)0x3b1d49523a902de0;
      local_90._8_4_ = 0.014;
      pRVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                         (&alloc_local,RGBColorSpace::sRGB,(RGB *)local_90);
      sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)pRVar4 | 0x4000000000000);
    }
  }
  if (sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"sigma_s",(allocator<char> *)&g);
    local_28 = (ParsedParameter *)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&sigScale,(string *)parameters,(SpectrumHandle *)local_90,
               (SpectrumType)&local_28,(Allocator)0x1);
    TVar2.bits._4_4_ = uStack_6c;
    TVar2.bits._0_4_ = sigScale;
    sig_s.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )TVar2.bits;
    std::__cxx11::string::~string((string *)local_90);
    if (TVar2.bits == 0) {
      local_90._0_8_ = (pointer)0x404d70a440233333;
      local_90._8_4_ = 3.77;
      pRVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                         (&alloc_local,RGBColorSpace::sRGB,(RGB *)local_90);
      sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)pRVar4 | 0x4000000000000);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"scale",(allocator<char> *)&g);
  local_ac = ParameterDictionary::GetOneFloat(parameters,(string *)local_90,1.0);
  std::__cxx11::string::~string((string *)local_90);
  sigScale = local_ac;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"g",&local_b1);
  local_ac = ParameterDictionary::GetOneFloat(parameters,(string *)local_90,0.0);
  std::__cxx11::string::~string((string *)local_90);
  g = local_ac;
  pGVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>,pbrt::NanoVDBMediumProvider_const*&,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,float&,pbrt::Transform_const&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&provider_local,&sig_a,&sig_s,&sigScale,&g,renderFromMedium,
                      &alloc_local);
  std::__cxx11::string::~string((string *)&preset);
  return pGVar5;
}

Assistant:

static GeneralMedium<DensityProvider> *Create(const DensityProvider *provider,
                                                  const ParameterDictionary &parameters,
                                                  const Transform &renderFromMedium,
                                                  const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(.0011f, .0024f, .014f));
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(2.55f, 3.21f, 3.77f));
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<GeneralMedium<DensityProvider>>(
            provider, sig_a, sig_s, sigScale, g, renderFromMedium, alloc);
    }